

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchSet.cpp
# Opt level: O3

double Hpipe::anon_unknown_5::cost_and_freq(Node *node,double cost)

{
  double *pdVar1;
  Node *node_00;
  Node *node_01;
  double dVar2;
  double local_18;
  
  node_00 = (node->ok).data;
  if (node_00 == (Node *)0x0) {
    dVar2 = cost * node->freq;
  }
  else {
    node_01 = (node->ko).data;
    pdVar1 = &node_01->freq;
    dVar2 = cost + 1.0;
    if (node_00->freq < *pdVar1 || node_00->freq == *pdVar1) {
      local_18 = cost_and_freq(node_00,dVar2 + 6.0);
    }
    else {
      local_18 = cost_and_freq(node_00,dVar2);
      dVar2 = dVar2 + 6.0;
    }
    dVar2 = cost_and_freq(node_01,dVar2);
    dVar2 = dVar2 + local_18;
  }
  return dVar2;
}

Assistant:

static double cost_and_freq( BranchSet::Node *node, double cost ) {
    if ( node->ok ) {
        if ( node->ok->freq > node->ko->freq ) {
            return cost_and_freq( node->ok.ptr(), cost + BranchSet::COST_TEST + 0 * BranchSet::COST_MISPREDICTION ) +
                   cost_and_freq( node->ko.ptr(), cost + BranchSet::COST_TEST + 1 * BranchSet::COST_MISPREDICTION );
        }
        return cost_and_freq( node->ok.ptr(), cost + BranchSet::COST_TEST + 1 * BranchSet::COST_MISPREDICTION ) +
               cost_and_freq( node->ko.ptr(), cost + BranchSet::COST_TEST + 0 * BranchSet::COST_MISPREDICTION );
    }
    return node->freq * cost;
}